

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatcherBase<const_phmap::priv::(anonymous_namespace)::BadTable_&>::~MatcherBase
          (MatcherBase<const_phmap::priv::(anonymous_namespace)::BadTable_&> *this)

{
  MatcherBase<const_phmap::priv::(anonymous_namespace)::BadTable_&> *this_local;
  
  (this->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0028e2b0;
  Destroy(this);
  MatcherDescriberInterface::~MatcherDescriberInterface(&this->super_MatcherDescriberInterface);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }